

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p256_64.h
# Opt level: O1

void fiat_p256_cmovznz(fiat_p256_limb_t *out,fiat_p256_limb_t t,fiat_p256_limb_t *z,
                      fiat_p256_limb_t *nz)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar7 = -(ulong)(t != 0);
  uVar8 = ~uVar7;
  uVar1 = nz[1];
  uVar2 = z[1];
  uVar3 = nz[2];
  uVar4 = z[2];
  uVar5 = nz[3];
  uVar6 = z[3];
  *out = *z & uVar8 | *nz & uVar7;
  out[1] = uVar2 & uVar8 | uVar1 & uVar7;
  out[2] = uVar4 & uVar8 | uVar3 & uVar7;
  out[3] = uVar8 & uVar6 | uVar7 & uVar5;
  return;
}

Assistant:

static FIAT_P256_FIAT_INLINE void fiat_p256_cmovznz_u64(uint64_t* out1, fiat_p256_uint1 arg1, uint64_t arg2, uint64_t arg3) {
  fiat_p256_uint1 x1;
  uint64_t x2;
  uint64_t x3;
  x1 = (!(!arg1));
  x2 = ((fiat_p256_int1)(0x0 - x1) & UINT64_C(0xffffffffffffffff));
  x3 = ((fiat_p256_value_barrier_u64(x2) & arg3) | (fiat_p256_value_barrier_u64((~x2)) & arg2));
  *out1 = x3;
}